

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O2

result_type_conflict3 * __thiscall
trng::snedecor_f_dist<long_double>::icdf_
          (result_type_conflict3 *__return_storage_ptr__,snedecor_f_dist<long_double> *this,
          result_type_conflict3 x)

{
  math::inv_Beta_I((longdouble *)__return_storage_ptr__,x._0_10_,
                   (longdouble)0.5 * (longdouble)*(int *)__return_storage_ptr__,
                   (longdouble)0.5 * (longdouble)*(int *)((long)__return_storage_ptr__ + 4));
  return (result_type_conflict3 *)(ulong)*(uint *)__return_storage_ptr__;
}

Assistant:

icdf_(result_type x) const {
      const result_type t{math::inv_Beta_I(x, result_type(1) / result_type(2) * P.n(),
                                           result_type(1) / result_type(2) * P.m())};
      return t / (1 - t) * static_cast<result_type>(P.m()) / static_cast<result_type>(P.n());
    }